

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

ExactFloat * __thiscall ExactFloat::ToUniqueString_abi_cxx11_(ExactFloat *this)

{
  uint uVar1;
  ExactFloat *in_RSI;
  ExactFloat local_58 [2];
  char local_38 [8];
  char prec_buf [20];
  ExactFloat *this_local;
  
  uVar1 = prec(in_RSI);
  sprintf(local_38,"<%d>",(ulong)uVar1);
  ToString_abi_cxx11_(local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  return this;
}

Assistant:

string ExactFloat::ToUniqueString() const {
  char prec_buf[20];
  sprintf(prec_buf, "<%d>", prec());
  return ToString() + prec_buf;
}